

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# script.c
# Opt level: O1

gs_val_t * gs_eval_expr(gs_val_t *__return_storage_ptr__,gs_eval_t *eval,gs_expr_t *expr)

{
  int *piVar1;
  vec_gs_val_t *pvVar2;
  undefined4 *puVar3;
  gs_expr_type gVar4;
  gs_expr_t *pgVar5;
  map_node_t *pmVar6;
  gs_val_t val_00;
  gs_val_t left;
  gs_val_t val_01;
  gs_val_t val_02;
  gs_val_t left_00;
  gs_val_t left_01;
  gs_val_t left_02;
  gs_val_t left_03;
  gs_val_t left_04;
  gs_val_t left_05;
  gs_val_t left_06;
  gs_val_t left_07;
  gs_val_t right;
  gs_val_t right_00;
  gs_val_t right_01;
  gs_val_t right_02;
  gs_val_t right_03;
  gs_val_t right_04;
  gs_val_t right_05;
  gs_val_t right_06;
  gs_val_t right_07;
  vec2 vVar7;
  vec2 vVar8;
  _Bool _Var9;
  undefined1 uVar10;
  uint uVar11;
  int iVar12;
  int iVar13;
  map_node_t **ppmVar14;
  vec_gs_val_t *data;
  vec_gs_val_t *pvVar15;
  golf_string_t *str;
  map_base_t *pmVar16;
  long lVar17;
  gs_val_t *pgVar18;
  long lVar19;
  bool bVar20;
  gs_val_type gVar21;
  uint *unaff_RBP;
  uint *puVar22;
  undefined8 uVar23;
  gs_eval_t *eval_00;
  char *pcVar24;
  ulong uVar25;
  undefined4 uVar26;
  float fVar27;
  undefined4 uVar28;
  gs_val_t left_val;
  gs_val_t right_val;
  gs_val_t val;
  gs_val_t *lval;
  undefined1 local_d8 [32];
  gs_val_t local_b8;
  undefined1 local_98 [8];
  anon_union_16_10_4eabebd3_for_gs_val_2 aStack_90;
  gs_stmt_t *local_78;
  char *local_70;
  gs_val_t local_68;
  gs_val_t *local_50;
  uint *local_48;
  gs_val_type local_3c;
  vec_gs_val_t *local_38;
  
  switch(expr->type) {
  case GS_EXPR_BINARY_OP:
    gs_eval_expr((gs_val_t *)local_d8,eval,(expr->field_2).binary_op.left);
    if ((_Bool)local_d8[4] == true) goto LAB_0013d8f9;
    gs_eval_expr(&local_b8,eval,(expr->field_2).binary_op.right);
    if (local_b8.is_return == true) {
      aStack_90._7_4_ = local_b8.field_2._8_4_ << 8;
      aStack_90.field10[0xb] = (undefined1)((uint)local_b8.field_2._8_4_ >> 0x18);
      aStack_90._12_4_ = local_b8.field_2._12_4_;
      uVar26 = CONCAT13(local_b8.type._3_1_,CONCAT12(local_b8.type._2_1_,(undefined2)local_b8.type))
      ;
      uVar28 = CONCAT13(local_b8._7_1_,CONCAT21(local_b8._5_2_,1));
      local_d8._8_4_ = local_b8.field_2.int_val;
      local_d8._12_4_ = local_b8.field_2.vec2_val.y;
      goto LAB_0013d90b;
    }
    switch((expr->field_2).int_val) {
    case 0:
      right.field_2._12_4_ = local_b8.field_2._12_4_;
      right.field_2.vec3_val.z = local_b8.field_2.vec3_val.z;
      right.type._2_1_ = local_b8.type._2_1_;
      right.type._0_2_ = (undefined2)local_b8.type;
      right.type._3_1_ = local_b8.type._3_1_;
      right.is_return = local_b8.is_return;
      right._5_2_ = local_b8._5_2_;
      right._7_1_ = local_b8._7_1_;
      right.field_2._4_4_ = local_b8.field_2.vec2_val.y;
      right.field_2.int_val = local_b8.field_2.int_val;
      left.field_2._12_4_ = local_d8._20_4_;
      left.field_2.vec3_val.z = (float)local_d8._16_4_;
      left.type._2_1_ = local_d8[2];
      left.type._0_2_ = local_d8._0_2_;
      left.type._3_1_ = local_d8[3];
      left.is_return = (_Bool)local_d8[4];
      left._5_2_ = local_d8._5_2_;
      left._7_1_ = local_d8[7];
      left.field_2._4_4_ = local_d8._12_4_;
      left.field_2.int_val = local_d8._8_4_;
      gs_eval_binary_op_add((gs_val_t *)local_98,eval,left,right);
      break;
    case 1:
      right_04.field_2._12_4_ = local_b8.field_2._12_4_;
      right_04.field_2.vec3_val.z = local_b8.field_2.vec3_val.z;
      right_04.type._2_1_ = local_b8.type._2_1_;
      right_04.type._0_2_ = (undefined2)local_b8.type;
      right_04.type._3_1_ = local_b8.type._3_1_;
      right_04.is_return = local_b8.is_return;
      right_04._5_2_ = local_b8._5_2_;
      right_04._7_1_ = local_b8._7_1_;
      right_04.field_2._4_4_ = local_b8.field_2.vec2_val.y;
      right_04.field_2.int_val = local_b8.field_2.int_val;
      left_04.field_2._12_4_ = local_d8._20_4_;
      left_04.field_2.vec3_val.z = (float)local_d8._16_4_;
      left_04.type._2_1_ = local_d8[2];
      left_04.type._0_2_ = local_d8._0_2_;
      left_04.type._3_1_ = local_d8[3];
      left_04.is_return = (_Bool)local_d8[4];
      left_04._5_2_ = local_d8._5_2_;
      left_04._7_1_ = local_d8[7];
      left_04.field_2._4_4_ = local_d8._12_4_;
      left_04.field_2.int_val = local_d8._8_4_;
      gs_eval_binary_op_sub((gs_val_t *)local_98,eval,left_04,right_04);
      break;
    case 2:
      right_01.field_2._12_4_ = local_b8.field_2._12_4_;
      right_01.field_2.vec3_val.z = local_b8.field_2.vec3_val.z;
      right_01.type._2_1_ = local_b8.type._2_1_;
      right_01.type._0_2_ = (undefined2)local_b8.type;
      right_01.type._3_1_ = local_b8.type._3_1_;
      right_01.is_return = local_b8.is_return;
      right_01._5_2_ = local_b8._5_2_;
      right_01._7_1_ = local_b8._7_1_;
      right_01.field_2._4_4_ = local_b8.field_2.vec2_val.y;
      right_01.field_2.int_val = local_b8.field_2.int_val;
      left_01.field_2._12_4_ = local_d8._20_4_;
      left_01.field_2.vec3_val.z = (float)local_d8._16_4_;
      left_01.type._2_1_ = local_d8[2];
      left_01.type._0_2_ = local_d8._0_2_;
      left_01.type._3_1_ = local_d8[3];
      left_01.is_return = (_Bool)local_d8[4];
      left_01._5_2_ = local_d8._5_2_;
      left_01._7_1_ = local_d8[7];
      left_01.field_2._4_4_ = local_d8._12_4_;
      left_01.field_2.int_val = local_d8._8_4_;
      gs_eval_binary_op_mul((gs_val_t *)local_98,eval,left_01,right_01);
      break;
    case 3:
      right_02.field_2._12_4_ = local_b8.field_2._12_4_;
      right_02.field_2.vec3_val.z = local_b8.field_2.vec3_val.z;
      right_02.type._2_1_ = local_b8.type._2_1_;
      right_02.type._0_2_ = (undefined2)local_b8.type;
      right_02.type._3_1_ = local_b8.type._3_1_;
      right_02.is_return = local_b8.is_return;
      right_02._5_2_ = local_b8._5_2_;
      right_02._7_1_ = local_b8._7_1_;
      right_02.field_2._4_4_ = local_b8.field_2.vec2_val.y;
      right_02.field_2.int_val = local_b8.field_2.int_val;
      left_02.field_2._12_4_ = local_d8._20_4_;
      left_02.field_2.vec3_val.z = (float)local_d8._16_4_;
      left_02.type._2_1_ = local_d8[2];
      left_02.type._0_2_ = local_d8._0_2_;
      left_02.type._3_1_ = local_d8[3];
      left_02.is_return = (_Bool)local_d8[4];
      left_02._5_2_ = local_d8._5_2_;
      left_02._7_1_ = local_d8[7];
      left_02.field_2._4_4_ = local_d8._12_4_;
      left_02.field_2.int_val = local_d8._8_4_;
      gs_eval_binary_op_div((gs_val_t *)local_98,eval,left_02,right_02);
      break;
    case 4:
      right_00.field_2._12_4_ = local_b8.field_2._12_4_;
      right_00.field_2.vec3_val.z = local_b8.field_2.vec3_val.z;
      right_00.type._2_1_ = local_b8.type._2_1_;
      right_00.type._0_2_ = (undefined2)local_b8.type;
      right_00.type._3_1_ = local_b8.type._3_1_;
      right_00.is_return = local_b8.is_return;
      right_00._5_2_ = local_b8._5_2_;
      right_00._7_1_ = local_b8._7_1_;
      right_00.field_2._4_4_ = local_b8.field_2.vec2_val.y;
      right_00.field_2.int_val = local_b8.field_2.int_val;
      left_00.field_2._12_4_ = local_d8._20_4_;
      left_00.field_2.vec3_val.z = (float)local_d8._16_4_;
      left_00.type._2_1_ = local_d8[2];
      left_00.type._0_2_ = local_d8._0_2_;
      left_00.type._3_1_ = local_d8[3];
      left_00.is_return = (_Bool)local_d8[4];
      left_00._5_2_ = local_d8._5_2_;
      left_00._7_1_ = local_d8[7];
      left_00.field_2._4_4_ = local_d8._12_4_;
      left_00.field_2.int_val = local_d8._8_4_;
      gs_eval_binary_op_lt((gs_val_t *)local_98,eval,left_00,right_00);
      break;
    case 5:
      right_05.field_2._12_4_ = local_b8.field_2._12_4_;
      right_05.field_2.vec3_val.z = local_b8.field_2.vec3_val.z;
      right_05.type._2_1_ = local_b8.type._2_1_;
      right_05.type._0_2_ = (undefined2)local_b8.type;
      right_05.type._3_1_ = local_b8.type._3_1_;
      right_05.is_return = local_b8.is_return;
      right_05._5_2_ = local_b8._5_2_;
      right_05._7_1_ = local_b8._7_1_;
      right_05.field_2._4_4_ = local_b8.field_2.vec2_val.y;
      right_05.field_2.int_val = local_b8.field_2.int_val;
      left_05.field_2._12_4_ = local_d8._20_4_;
      left_05.field_2.vec3_val.z = (float)local_d8._16_4_;
      left_05.type._2_1_ = local_d8[2];
      left_05.type._0_2_ = local_d8._0_2_;
      left_05.type._3_1_ = local_d8[3];
      left_05.is_return = (_Bool)local_d8[4];
      left_05._5_2_ = local_d8._5_2_;
      left_05._7_1_ = local_d8[7];
      left_05.field_2._4_4_ = local_d8._12_4_;
      left_05.field_2.int_val = local_d8._8_4_;
      gs_eval_binary_op_gt((gs_val_t *)local_98,eval,left_05,right_05);
      break;
    case 6:
      right_06.field_2._12_4_ = local_b8.field_2._12_4_;
      right_06.field_2.vec3_val.z = local_b8.field_2.vec3_val.z;
      right_06.type._2_1_ = local_b8.type._2_1_;
      right_06.type._0_2_ = (undefined2)local_b8.type;
      right_06.type._3_1_ = local_b8.type._3_1_;
      right_06.is_return = local_b8.is_return;
      right_06._5_2_ = local_b8._5_2_;
      right_06._7_1_ = local_b8._7_1_;
      right_06.field_2._4_4_ = local_b8.field_2.vec2_val.y;
      right_06.field_2.int_val = local_b8.field_2.int_val;
      left_06.field_2._12_4_ = local_d8._20_4_;
      left_06.field_2.vec3_val.z = (float)local_d8._16_4_;
      left_06.type._2_1_ = local_d8[2];
      left_06.type._0_2_ = local_d8._0_2_;
      left_06.type._3_1_ = local_d8[3];
      left_06.is_return = (_Bool)local_d8[4];
      left_06._5_2_ = local_d8._5_2_;
      left_06._7_1_ = local_d8[7];
      left_06.field_2._4_4_ = local_d8._12_4_;
      left_06.field_2.int_val = local_d8._8_4_;
      gs_eval_binary_op_lte((gs_val_t *)local_98,eval,left_06,right_06);
      break;
    case 7:
      right_03.field_2._12_4_ = local_b8.field_2._12_4_;
      right_03.field_2.vec3_val.z = local_b8.field_2.vec3_val.z;
      right_03.type._2_1_ = local_b8.type._2_1_;
      right_03.type._0_2_ = (undefined2)local_b8.type;
      right_03.type._3_1_ = local_b8.type._3_1_;
      right_03.is_return = local_b8.is_return;
      right_03._5_2_ = local_b8._5_2_;
      right_03._7_1_ = local_b8._7_1_;
      right_03.field_2._4_4_ = local_b8.field_2.vec2_val.y;
      right_03.field_2.int_val = local_b8.field_2.int_val;
      left_03.field_2._12_4_ = local_d8._20_4_;
      left_03.field_2.vec3_val.z = (float)local_d8._16_4_;
      left_03.type._2_1_ = local_d8[2];
      left_03.type._0_2_ = local_d8._0_2_;
      left_03.type._3_1_ = local_d8[3];
      left_03.is_return = (_Bool)local_d8[4];
      left_03._5_2_ = local_d8._5_2_;
      left_03._7_1_ = local_d8[7];
      left_03.field_2._4_4_ = local_d8._12_4_;
      left_03.field_2.int_val = local_d8._8_4_;
      gs_eval_binary_op_gte((gs_val_t *)local_98,eval,left_03,right_03);
      break;
    case 8:
      right_07.field_2._12_4_ = local_b8.field_2._12_4_;
      right_07.field_2.vec3_val.z = local_b8.field_2.vec3_val.z;
      right_07.type._2_1_ = local_b8.type._2_1_;
      right_07.type._0_2_ = (undefined2)local_b8.type;
      right_07.type._3_1_ = local_b8.type._3_1_;
      right_07.is_return = local_b8.is_return;
      right_07._5_2_ = local_b8._5_2_;
      right_07._7_1_ = local_b8._7_1_;
      right_07.field_2._4_4_ = local_b8.field_2.vec2_val.y;
      right_07.field_2.int_val = local_b8.field_2.int_val;
      left_07.field_2._12_4_ = local_d8._20_4_;
      left_07.field_2.vec3_val.z = (float)local_d8._16_4_;
      left_07.type._2_1_ = local_d8[2];
      left_07.type._0_2_ = local_d8._0_2_;
      left_07.type._3_1_ = local_d8[3];
      left_07.is_return = (_Bool)local_d8[4];
      left_07._5_2_ = local_d8._5_2_;
      left_07._7_1_ = local_d8[7];
      left_07.field_2._4_4_ = local_d8._12_4_;
      left_07.field_2.int_val = local_d8._8_4_;
      gs_eval_binary_op_eq((gs_val_t *)local_98,eval,left_07,right_07);
      break;
    case 9:
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/common/script.c"
                    ,0x416,"gs_val_t gs_eval_expr_binary_op(gs_eval_t *, gs_expr_t *)");
    }
    goto switchD_0013d5b0_default;
  case GS_EXPR_ASSIGNMENT:
    gs_eval_expr((gs_val_t *)local_d8,eval,(expr->field_2).binary_op.left);
    if ((_Bool)local_d8[4] == false) {
      gs_eval_lval(&local_b8,eval,(expr->field_2).assignment.left,(gs_val_t **)&local_68);
      _Var9 = local_b8.is_return;
      gVar21 = CONCAT13(local_b8.type._3_1_,CONCAT12(local_b8.type._2_1_,(undefined2)local_b8.type))
      ;
      local_98._0_2_ = local_b8._5_2_;
      local_98[2] = local_b8._7_1_;
      local_98[3] = local_b8.field_2.bool_val;
      local_98[4] = SUB41((uint)local_b8.field_2._0_4_ >> 8,0);
      local_98._5_2_ = (undefined2)((uint)local_b8.field_2._0_4_ >> 0x10);
      stack0xffffffffffffff6f = local_b8.field_2._4_4_;
      aStack_90._3_4_ = local_b8.field_2.vec3_val.z;
      aStack_90._7_4_ = local_b8.field_2._12_4_;
      if ((local_b8.is_return & 1U) == 0) {
        if ((gs_val_t *)local_68._0_8_ == (gs_val_t *)0x0) {
          __assert_fail("lval",
                        "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/common/script.c"
                        ,0x42a,"gs_val_t gs_eval_expr_assignment(gs_eval_t *, gs_expr_t *)");
        }
        pgVar5 = (expr->field_2).assignment.left;
        gVar4 = pgVar5->type;
        if (gVar4 != GS_EXPR_ARRAY_ACCESS) {
          if (gVar4 == GS_EXPR_MEMBER_ACCESS) {
            pcVar24 = *(char **)((long)&pgVar5->field_2 + 0x18);
            iVar13 = CONCAT13(local_d8[3],CONCAT12(local_d8[2],local_d8._0_2_));
            if (iVar13 == 2) {
              local_b8.field_2.float_val = (float)(int)local_d8._8_4_;
              local_b8.type._0_2_ = GS_VAL_FLOAT;
              local_b8.type._2_1_ = GS_VAL_VOID >> 0x10;
              local_b8.type._3_1_ = GS_VAL_VOID >> 0x18;
              local_b8.is_return = false;
            }
            else if (iVar13 == 3) {
              local_b8.type._0_2_ = local_d8._0_2_;
              local_b8.type._2_1_ = local_d8[2];
              local_b8.type._3_1_ = local_d8[3];
              local_b8.is_return = (_Bool)local_d8[4];
              local_b8._5_2_ = local_d8._5_2_;
              local_b8._7_1_ = local_d8[7];
              local_b8.field_2.int_val = local_d8._8_4_;
              local_b8.field_2._4_4_ = local_d8._12_4_;
              local_b8.field_2.vec3_val.z = (float)local_d8._16_4_;
              local_b8.field_2._12_4_ = local_d8._20_4_;
            }
            else {
              gs_val_error(&local_b8,"Unable to perform cast");
            }
            local_d8._16_4_ = local_b8.field_2.vec3_val.z;
            local_d8._20_4_ = local_b8.field_2._12_4_;
            local_d8._0_2_ = (undefined2)local_b8.type;
            local_d8[2] = local_b8.type._2_1_;
            local_d8[3] = local_b8.type._3_1_;
            local_d8[4] = local_b8.is_return;
            local_d8._5_2_ = local_b8._5_2_;
            local_d8[7] = local_b8._7_1_;
            local_d8._8_4_ = local_b8.field_2.int_val;
            local_d8._12_4_ = local_b8.field_2._4_4_;
            if (local_b8.is_return == true) {
              gVar21 = CONCAT13(local_b8.type._3_1_,
                                CONCAT12(local_b8.type._2_1_,(undefined2)local_b8.type));
              local_98._0_2_ = local_b8._5_2_;
              local_98[2] = local_b8._7_1_;
              local_98[3] = (undefined1)local_b8.field_2.int_val;
              local_98[4] = SUB41((uint)local_b8.field_2._0_4_ >> 8,0);
              local_98._5_2_ = (undefined2)((uint)local_b8.field_2._0_4_ >> 0x10);
              stack0xffffffffffffff6f = local_b8.field_2._4_4_;
              aStack_90._3_4_ = local_b8.field_2.vec3_val.z;
              aStack_90._7_4_ = local_b8.field_2._12_4_;
              bVar20 = false;
            }
            else {
              if (*(gs_val_type *)local_68._0_8_ == GS_VAL_VEC3) {
                iVar13 = strcmp(pcVar24,"x");
                if (iVar13 == 0) {
LAB_0013ddb2:
                  ((anon_union_16_10_4eabebd3_for_gs_val_2 *)(local_68._0_8_ + 8))->int_val =
                       local_d8._8_4_;
                }
                else {
                  iVar13 = strcmp(pcVar24,"y");
                  if (iVar13 == 0) {
                    *(undefined4 *)(local_68._0_8_ + 8 + 4) = local_d8._8_4_;
                  }
                  else {
                    iVar13 = strcmp(pcVar24,"z");
                    if (iVar13 == 0) {
                      *(undefined4 *)(local_68._0_8_ + 8 + 8) = local_d8._8_4_;
                    }
                  }
                }
              }
              else {
                if (*(gs_val_type *)local_68._0_8_ != GS_VAL_VEC2) {
                  bVar20 = false;
                  gs_val_error(&local_b8,"Unable to perform member access on type");
                  gVar21 = CONCAT13(local_b8.type._3_1_,
                                    CONCAT12(local_b8.type._2_1_,(undefined2)local_b8.type));
                  local_98._0_2_ = local_b8._5_2_;
                  local_98[2] = local_b8._7_1_;
                  local_98[3] = (undefined1)local_b8.field_2.int_val;
                  local_98[4] = SUB41((uint)local_b8.field_2._0_4_ >> 8,0);
                  local_98._5_2_ = (undefined2)((uint)local_b8.field_2._0_4_ >> 0x10);
                  stack0xffffffffffffff6f = local_b8.field_2._4_4_;
                  aStack_90._3_4_ = local_b8.field_2.vec3_val.z;
                  aStack_90._7_4_ = local_b8.field_2._12_4_;
                  goto LAB_0013ddd2;
                }
                iVar13 = strcmp(pcVar24,"x");
                if (iVar13 == 0) goto LAB_0013ddb2;
                iVar13 = strcmp(pcVar24,"y");
                if (iVar13 == 0) {
                  *(undefined4 *)(local_68._0_8_ + 8 + 4) = local_d8._8_4_;
                }
              }
              bVar20 = true;
              local_b8.is_return = _Var9;
            }
LAB_0013ddd2:
            if (bVar20) goto LAB_0013dddf;
            goto LAB_0013ddf5;
          }
          val_02.field_2._12_4_ = local_d8._20_4_;
          val_02.field_2.vec3_val.z = (float)local_d8._16_4_;
          val_02.type._2_1_ = local_d8[2];
          val_02.type._0_2_ = local_d8._0_2_;
          val_02.type._3_1_ = local_d8[3];
          val_02.is_return = (_Bool)local_d8[4];
          val_02._5_2_ = local_d8._5_2_;
          val_02._7_1_ = local_d8[7];
          val_02.field_2._4_4_ = local_d8._12_4_;
          val_02.field_2.int_val = local_d8._8_4_;
          gs_eval_cast(&local_b8,eval,val_02,*(gs_val_type *)local_68._0_8_);
          local_d8._16_4_ = local_b8.field_2.vec3_val.z;
          local_d8._20_4_ = local_b8.field_2._12_4_;
          local_d8._0_2_ = (undefined2)local_b8.type;
          local_d8[2] = local_b8.type._2_1_;
          local_d8[3] = local_b8.type._3_1_;
          local_d8[4] = local_b8.is_return;
          local_d8._5_2_ = local_b8._5_2_;
          local_d8[7] = local_b8._7_1_;
          local_d8._8_4_ = local_b8.field_2.int_val;
          local_d8._12_4_ = local_b8.field_2._4_4_;
          if (local_b8.is_return != false) goto LAB_0013dddf;
        }
        *(ulong *)(local_68._0_8_ + 8 + 8) = CONCAT44(local_d8._20_4_,local_d8._16_4_);
        vVar7.y = (float)local_d8._12_4_;
        vVar7.x = (float)local_d8._8_4_;
        *(ulong *)local_68._0_8_ =
             CONCAT17(local_d8[7],
                      CONCAT25(local_d8._5_2_,
                               CONCAT14(local_d8[4],
                                        CONCAT13(local_d8[3],CONCAT12(local_d8[2],local_d8._0_2_))))
                     );
        ((anon_union_16_10_4eabebd3_for_gs_val_2 *)(local_68._0_8_ + 8))->vec2_val = vVar7;
        goto LAB_0013dddf;
      }
    }
    else {
LAB_0013dddf:
      gVar21 = CONCAT13(local_d8[3],CONCAT12(local_d8[2],local_d8._0_2_));
      local_98._0_2_ = local_d8._5_2_;
      local_98[2] = local_d8[7];
      local_98[3] = (undefined1)local_d8._8_4_;
      local_98[4] = SUB41(local_d8._8_4_,1);
      local_98._5_2_ = SUB42(local_d8._8_4_,2);
      stack0xffffffffffffff6f = (float)local_d8._12_4_;
      aStack_90._3_4_ = local_d8._16_4_;
      aStack_90._7_4_ = local_d8._20_4_;
      local_b8.is_return = (_Bool)local_d8[4];
    }
LAB_0013ddf5:
    __return_storage_ptr__->type = gVar21;
    __return_storage_ptr__->is_return = local_b8.is_return;
    *(ulong *)&__return_storage_ptr__->field_0x5 =
         CONCAT17(local_98[7],
                  CONCAT25(local_98._5_2_,
                           CONCAT14(local_98[4],
                                    CONCAT13(local_98[3],CONCAT12(local_98[2],local_98._0_2_)))));
    *(ulong *)((long)&__return_storage_ptr__->field_2 + 5) =
         CONCAT17(aStack_90.field10[7],CONCAT43(aStack_90._3_4_,aStack_90.int_val._0_3_));
    *(undefined4 *)((long)&__return_storage_ptr__->field_2 + 0xc) = aStack_90._7_4_;
    break;
  case GS_EXPR_INT:
    iVar13 = (expr->field_2).int_val;
    __return_storage_ptr__->type = GS_VAL_INT;
    __return_storage_ptr__->is_return = false;
    (__return_storage_ptr__->field_2).int_val = iVar13;
    break;
  case GS_EXPR_FLOAT:
    iVar13 = (expr->field_2).int_val;
    __return_storage_ptr__->type = GS_VAL_FLOAT;
    __return_storage_ptr__->is_return = false;
    (__return_storage_ptr__->field_2).int_val = iVar13;
    break;
  case GS_EXPR_SYMBOL:
    uVar25 = (ulong)(uint)(eval->env).length;
    bVar20 = false;
    do {
      if ((int)uVar25 < 1) break;
      pmVar16 = (map_base_t *)(eval->env).data[uVar25 - 1];
      ppmVar14 = (map_node_t **)map_get_(pmVar16,(expr->field_2).symbol);
      pmVar16[1].buckets = ppmVar14;
      if (ppmVar14 != (map_node_t **)0x0) {
        local_d8._16_4_ = SUB84(ppmVar14[2],0);
        local_d8._20_4_ = (undefined4)((ulong)ppmVar14[2] >> 0x20);
        pmVar6 = *ppmVar14;
        local_d8._0_2_ = SUB82(pmVar6,0);
        local_d8[2] = (undefined1)((ulong)pmVar6 >> 0x10);
        local_d8[3] = (undefined1)((ulong)pmVar6 >> 0x18);
        local_d8[4] = (byte)((ulong)pmVar6 >> 0x20);
        local_d8._5_2_ = (undefined2)((ulong)pmVar6 >> 0x28);
        local_d8[7] = (undefined1)((ulong)pmVar6 >> 0x38);
        local_d8._8_4_ = SUB84(ppmVar14[1],0);
        local_d8._12_4_ = (undefined4)((ulong)ppmVar14[1] >> 0x20);
        bVar20 = true;
      }
      uVar25 = uVar25 - 1;
    } while (ppmVar14 == (map_node_t **)0x0);
    if (!bVar20) {
      gs_val_error((gs_val_t *)local_d8,"Could not find symbol %s",(expr->field_2).symbol);
    }
    *(ulong *)((long)&__return_storage_ptr__->field_2 + 8) =
         CONCAT44(local_d8._20_4_,local_d8._16_4_);
    local_68.type = CONCAT13(local_d8[3],CONCAT12(local_d8[2],local_d8._0_2_));
    local_68._5_2_ = local_d8._5_2_;
    local_68.is_return = (_Bool)local_d8[4];
    local_68._7_1_ = local_d8[7];
    local_b8.field_2.int_val = local_d8._8_4_;
    local_b8.field_2.vec2_val.y = (float)local_d8._12_4_;
    goto LAB_0013d921;
  case GS_EXPR_STRING:
    str = (golf_string_t *)golf_alloc_tracked(0x18,"script/eval");
    iVar13 = vec_expand_((char **)eval,&(eval->allocated_strings).length,
                         &(eval->allocated_strings).capacity,8,
                         (eval->allocated_strings).alloc_category);
    if (iVar13 == 0) {
      iVar13 = (eval->allocated_strings).length;
      (eval->allocated_strings).length = iVar13 + 1;
      (eval->allocated_strings).data[iVar13] = str;
    }
    golf_string_init(str,"script/eval",(expr->field_2).symbol);
    __return_storage_ptr__->type = GS_VAL_STRING;
    __return_storage_ptr__->is_return = false;
    (__return_storage_ptr__->field_2).string_val = str;
    break;
  case GS_EXPR_CALL:
    local_50 = __return_storage_ptr__;
    pmVar16 = (map_base_t *)
              golf_alloc_tracked(0x38,
                                 "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/common/script.c"
                                );
    pmVar16->buckets = (map_node_t **)0x0;
    pmVar16->nbuckets = 0;
    pmVar16->nnodes = 0;
    pmVar16[1].buckets = (map_node_t **)0x0;
    pmVar16[1].nbuckets = 0;
    pmVar16[1].nnodes = 0;
    pmVar16[2].buckets = (map_node_t **)0x0;
    pmVar16[2].nbuckets = 0;
    pmVar16[2].nnodes = 0;
    pmVar16[3].buckets = (map_node_t **)"script/eval";
    local_d8._0_2_ = GS_VAL_VOID;
    local_d8[2] = GS_VAL_VOID >> 0x10;
    local_d8[3] = GS_VAL_VOID >> 0x18;
    local_d8[4] = false;
    local_d8._5_2_ = 0;
    local_d8[7] = 0;
    local_d8._8_4_ = 0;
    local_d8._12_4_ = 0.0;
    local_d8._16_4_ = 3.333218e-39;
    local_d8._20_4_ = 0;
    gs_eval_expr(&local_68,eval,(expr->field_2).assignment.left);
    if (local_68.is_return == false) {
      if (local_68.type != GS_VAL_FN) {
        if (local_68.type == GS_VAL_C_FN) {
          if (0 < (expr->field_2).call.num_args) {
            lVar19 = 0;
            do {
              gs_eval_expr(&local_b8,eval,
                           *(gs_expr_t **)(&((expr->field_2).binary_op.right)->type + lVar19 * 2));
              _Var9 = local_b8.is_return;
              iVar13 = 2;
              pgVar18 = &local_68;
              if (local_b8.is_return == false) {
                iVar12 = vec_expand_((char **)local_d8,&(((gs_val_t *)local_d8)->field_2).int_val,
                                     (int *)&(((gs_val_t *)local_d8)->field_2).vec2_val.y,0x18,
                                     (char *)CONCAT44(local_d8._20_4_,local_d8._16_4_));
                iVar13 = 0;
                if (iVar12 == 0) {
                  lVar17 = (long)(int)local_d8._8_4_;
                  local_d8._8_4_ = local_d8._8_4_ + 1;
                  pgVar18 = (gs_val_t *)
                            (lVar17 * 0x18 +
                            CONCAT17(local_d8[7],
                                     CONCAT25(local_d8._5_2_,
                                              CONCAT14(local_d8[4],
                                                       CONCAT13(local_d8[3],
                                                                CONCAT12(local_d8[2],local_d8._0_2_)
                                                               )))));
                  iVar13 = 0;
                  goto LAB_0013d379;
                }
              }
              else {
LAB_0013d379:
                *(ulong *)((long)&pgVar18->field_2 + 8) =
                     CONCAT44(local_b8.field_2._12_4_,local_b8.field_2.vec3_val.z);
                uVar26 = CONCAT13(local_b8.type._3_1_,
                                  CONCAT12(local_b8.type._2_1_,(undefined2)local_b8.type));
                vVar8.y = local_b8.field_2.vec2_val.y;
                vVar8.x = local_b8.field_2.float_val;
                pgVar18->type = uVar26;
                pgVar18->is_return = local_b8.is_return;
                *(int3 *)&pgVar18->field_0x5 =
                     (int3)(CONCAT17(local_b8._7_1_,
                                     CONCAT25(local_b8._5_2_,CONCAT14(local_b8.is_return,uVar26)))
                           >> 0x28);
                (pgVar18->field_2).vec2_val = vVar8;
              }
              if (_Var9 != false) goto LAB_0013d3a3;
              lVar19 = lVar19 + 1;
            } while (lVar19 < (expr->field_2).call.num_args);
          }
          iVar13 = 6;
LAB_0013d3a3:
          if (iVar13 != 2) {
            if (iVar13 != 6) goto LAB_0013d868;
            (*local_68.field_2.c_fn)
                      (&local_68,eval,
                       (gs_val_t *)
                       CONCAT17(local_d8[7],
                                CONCAT25(local_d8._5_2_,
                                         CONCAT14(local_d8[4],
                                                  CONCAT13(local_d8[3],
                                                           CONCAT12(local_d8[2],local_d8._0_2_))))),
                       local_d8._8_4_);
            if (local_68.type != GS_VAL_ERROR) {
              local_68.is_return = false;
            }
          }
        }
        else {
          gs_val_error(&local_68,"Expected a function when evaling call expr");
        }
        goto LAB_0013d84e;
      }
      if ((expr->field_2).call.num_args == ((local_68.field_2.fn_stmt)->field_1).fn_decl.num_args) {
        uVar23 = local_68.field_2.vec2_val;
        if (0 < ((local_68.field_2.fn_stmt)->field_1).fn_decl.num_args) {
          local_48 = &pmVar16[1].nbuckets;
          lVar19 = 2;
          lVar17 = 0;
          local_78 = local_68.field_2.fn_stmt;
          do {
            local_70 = *(char **)(&((local_78->field_1).for_stmt.inc)->type + lVar19 * 2);
            gVar4 = (&((local_78->field_1).for_stmt.cond)->type)[lVar17];
            eval_00 = eval;
            gs_eval_expr(&local_b8,eval,
                         *(gs_expr_t **)(&((expr->field_2).binary_op.right)->type + lVar17 * 2));
            if (local_b8.is_return == true) {
LAB_0013d697:
              local_68.field_2._8_8_ = CONCAT44(local_b8.field_2._12_4_,local_b8.field_2.vec3_val.z)
              ;
              local_68._0_8_ =
                   CONCAT17(local_b8._7_1_,
                            CONCAT25(local_b8._5_2_,
                                     CONCAT14(local_b8.is_return,
                                              CONCAT13(local_b8.type._3_1_,
                                                       CONCAT12(local_b8.type._2_1_,
                                                                (undefined2)local_b8.type)))));
              local_68.field_2.vec2_val.y = local_b8.field_2.vec2_val.y;
              local_68.field_2.int_val = local_b8.field_2.int_val;
              uVar11 = 2;
              bVar20 = false;
            }
            else {
              val_01.field_2._12_4_ = local_b8.field_2._12_4_;
              val_01.field_2.vec3_val.z = local_b8.field_2.vec3_val.z;
              val_01.type._2_1_ = local_b8.type._2_1_;
              val_01.type._0_2_ = (undefined2)local_b8.type;
              val_01.type._3_1_ = local_b8.type._3_1_;
              val_01.is_return = local_b8.is_return;
              val_01._5_2_ = local_b8._5_2_;
              val_01._7_1_ = local_b8._7_1_;
              val_01.field_2.vec2_val.y = local_b8.field_2.vec2_val.y;
              val_01.field_2.int_val = local_b8.field_2.int_val;
              gs_eval_cast((gs_val_t *)local_98,eval_00,val_01,gVar4);
              local_b8.field_2.vec3_val.z = (float)CONCAT13(aStack_90.field10[0xb],aStack_90._8_3_);
              local_b8.field_2._12_4_ = aStack_90._12_4_;
              local_b8.type._0_2_ = local_98._0_2_;
              local_b8.type._2_1_ = local_98[2];
              local_b8.type._3_1_ = local_98[3];
              local_b8.is_return = local_98[4];
              local_b8._5_2_ = local_98._5_2_;
              local_b8._7_1_ = local_98[7];
              local_b8.field_2.int_val = (int)CONCAT43(aStack_90._3_4_,aStack_90.int_val._0_3_);
              local_b8.field_2.vec2_val.y =
                   (float)(CONCAT17(aStack_90.field10[7],
                                    CONCAT43(aStack_90._3_4_,aStack_90.int_val._0_3_)) >> 0x20);
              if (local_98[4] == true) goto LAB_0013d697;
              *(ulong *)(local_48 + 4) = CONCAT44(aStack_90._12_4_,local_b8.field_2.vec3_val.z);
              *(ulong *)local_48 =
                   CONCAT17(local_98[7],
                            CONCAT25(local_98._5_2_,
                                     CONCAT14(local_98[4],
                                              CONCAT13(local_98[3],
                                                       CONCAT12(local_98[2],local_98._0_2_)))));
              *(ulong *)(local_48 + 2) =
                   CONCAT44(local_b8.field_2.vec2_val.y,local_b8.field_2.int_val);
              map_set_(pmVar16,local_70,local_48,0x18,(char *)pmVar16[3].buckets);
              uVar11 = 0;
              bVar20 = true;
            }
            uVar23 = local_78;
            if (!bVar20) goto LAB_0013d716;
            lVar17 = lVar17 + 1;
            lVar19 = lVar19 + 3;
          } while (lVar17 < (local_78->field_1).fn_decl.num_args);
        }
        uVar11 = 3;
LAB_0013d716:
        if (uVar11 == 3) {
          piVar1 = &(eval->env).length;
          iVar13 = vec_expand_((char **)&eval->env,piVar1,&(eval->env).capacity,8,
                               (eval->env).alloc_category);
          if (iVar13 == 0) {
            iVar13 = *piVar1;
            *piVar1 = iVar13 + 1;
            (eval->env).data[iVar13] = (gs_env_t *)pmVar16;
          }
          gs_eval_stmt(&local_68,eval,(((gs_stmt_t *)uVar23)->field_1).for_stmt.body);
          if (local_68.type != GS_VAL_ERROR) {
            local_68.is_return = false;
          }
          *piVar1 = *piVar1 + -1;
          uVar11 = 0;
        }
      }
      else {
        gs_val_error(&local_68,"Wrong number of args passed to function call");
        uVar11 = 0;
      }
      if ((uVar11 & 1) == 0) goto LAB_0013d84e;
    }
    else {
LAB_0013d84e:
      map_deinit_(pmVar16);
      golf_free_tracked(pmVar16);
      golf_free_tracked((void *)CONCAT17(local_d8[7],
                                         CONCAT25(local_d8._5_2_,
                                                  CONCAT14(local_d8[4],
                                                           CONCAT13(local_d8[3],
                                                                    CONCAT12(local_d8[2],
                                                                             local_d8._0_2_))))));
    }
LAB_0013d868:
    *(undefined8 *)((long)&local_50->field_2 + 8) = local_68.field_2._8_8_;
    __return_storage_ptr__ = local_50;
    local_b8.field_2.int_val = local_68.field_2.int_val;
    local_b8.field_2.vec2_val.y = local_68.field_2.vec2_val.y;
    goto LAB_0013d921;
  case GS_EXPR_MEMBER_ACCESS:
    gs_eval_expr((gs_val_t *)local_d8,eval,(expr->field_2).assignment.left);
    if ((_Bool)local_d8[4] == false) {
      pcVar24 = *(char **)((long)&expr->field_2 + 0x18);
      iVar13 = CONCAT13(local_d8[3],CONCAT12(local_d8[2],local_d8._0_2_));
      if (iVar13 == 6) {
        iVar13 = strcmp(pcVar24,"length");
        if (iVar13 == 0) {
          local_d8._8_4_ = *(float *)(CONCAT44(local_d8._12_4_,local_d8._8_4_) + 8);
          local_d8._0_2_ = GS_VAL_INT;
          local_d8[2] = GS_VAL_VOID >> 0x10;
          local_d8[3] = GS_VAL_VOID >> 0x18;
          local_d8[4] = false;
          goto LAB_0013dcf8;
        }
        pcVar24 = "Invalid member for list";
      }
      else if (iVar13 == 5) {
        iVar13 = strcmp(pcVar24,"x");
        if (iVar13 == 0) {
LAB_0013d81d:
          local_d8._0_2_ = GS_VAL_FLOAT;
          local_d8[2] = GS_VAL_VOID >> 0x10;
          local_d8[3] = GS_VAL_VOID >> 0x18;
          local_d8[4] = false;
          goto LAB_0013dcf8;
        }
        iVar13 = strcmp(pcVar24,"y");
        fVar27 = (float)local_d8._12_4_;
        if ((iVar13 == 0) ||
           (iVar13 = strcmp(pcVar24,"z"), fVar27 = (float)local_d8._16_4_, iVar13 == 0)) {
LAB_0013dce5:
          local_d8._0_2_ = GS_VAL_FLOAT;
          local_d8[2] = GS_VAL_VOID >> 0x10;
          local_d8[3] = GS_VAL_VOID >> 0x18;
          local_d8[4] = false;
          local_d8._8_4_ = fVar27;
          goto LAB_0013dcf8;
        }
        pcVar24 = "Invalid member for vec3";
      }
      else if (iVar13 == 4) {
        iVar13 = strcmp(pcVar24,"x");
        if (iVar13 == 0) goto LAB_0013d81d;
        iVar13 = strcmp(pcVar24,"y");
        fVar27 = (float)local_d8._12_4_;
        if (iVar13 == 0) goto LAB_0013dce5;
        pcVar24 = "Invalid member for vec2";
      }
      else {
        pcVar24 = "Invalid type for member access";
      }
      gs_val_error((gs_val_t *)local_d8,pcVar24);
    }
LAB_0013dcf8:
    *(ulong *)((long)&__return_storage_ptr__->field_2 + 8) =
         CONCAT44(local_d8._20_4_,local_d8._16_4_);
    __return_storage_ptr__->type = CONCAT13(local_d8[3],CONCAT12(local_d8[2],local_d8._0_2_));
    __return_storage_ptr__->is_return = (_Bool)local_d8[4];
    *(undefined2 *)&__return_storage_ptr__->field_0x5 = local_d8._5_2_;
    __return_storage_ptr__->field_0x7 = local_d8[7];
    (__return_storage_ptr__->field_2).int_val = local_d8._8_4_;
    (__return_storage_ptr__->field_2).vec2_val.y = (float)local_d8._12_4_;
    break;
  case GS_EXPR_ARRAY_ACCESS:
    gs_eval_expr((gs_val_t *)local_d8,eval,(expr->field_2).assignment.left);
    if (((_Bool)local_d8[4] != true) &&
       (gs_eval_expr(&local_b8,eval,(expr->field_2).binary_op.left), local_b8.is_return != true)) {
      iVar13 = CONCAT13(local_b8.type._3_1_,CONCAT12(local_b8.type._2_1_,(undefined2)local_b8.type))
      ;
      if (iVar13 == 3) {
        local_98._0_2_ = GS_VAL_INT;
        local_98[2] = GS_VAL_VOID >> 0x10;
        local_98[3] = GS_VAL_VOID >> 0x18;
        local_98[4] = false;
        aStack_90.int_val._0_3_ = (undefined3)(int)local_b8.field_2.float_val;
        aStack_90.field10[3] = (undefined1)((uint)(int)local_b8.field_2.float_val >> 0x18);
      }
      else if (iVar13 == 2) {
        local_98._0_2_ = (undefined2)local_b8.type;
        local_98[2] = local_b8.type._2_1_;
        local_98[3] = local_b8.type._3_1_;
        local_98[4] = local_b8.is_return;
        local_98._5_2_ = local_b8._5_2_;
        aStack_90.int_val._0_3_ = (undefined3)local_b8.field_2.int_val;
        local_98[7] = local_b8._7_1_;
        aStack_90._4_3_ = SUB43(local_b8.field_2.vec2_val.y,0);
        aStack_90._3_4_ = CONCAT31(aStack_90._4_3_,(char)((uint)local_b8.field_2._0_4_ >> 0x18));
        aStack_90._7_4_ =
             (undefined4)(CONCAT44(local_b8.field_2.vec3_val.z,local_b8.field_2.vec2_val.y) >> 0x18)
        ;
        aStack_90.field10[0xb] = (undefined1)((uint)local_b8.field_2._8_4_ >> 0x18);
        aStack_90._12_4_ = local_b8.field_2._12_4_;
      }
      else {
        gs_val_error((gs_val_t *)local_98,"Unable to perform cast");
      }
      local_b8.field_2.vec3_val.z = (float)CONCAT13(aStack_90.field10[0xb],aStack_90._8_3_);
      local_b8.field_2._12_4_ = aStack_90._12_4_;
      local_b8.type._0_2_ = local_98._0_2_;
      local_b8.type._2_1_ = local_98[2];
      local_b8.type._3_1_ = local_98[3];
      local_b8.is_return = local_98[4];
      local_b8._5_2_ = local_98._5_2_;
      local_b8._7_1_ = local_98[7];
      local_b8.field_2.int_val = CONCAT13(aStack_90.field10[3],aStack_90.int_val._0_3_);
      local_b8.field_2.vec2_val.y = (float)CONCAT13(aStack_90.field10[7],aStack_90._4_3_);
      if (local_98[4] != true) {
        if (CONCAT13(local_d8[3],CONCAT12(local_d8[2],local_d8._0_2_)) == 6) {
          lVar19 = (long)local_b8.field_2.int_val;
          if ((-1 < lVar19) &&
             (local_b8.field_2.int_val < (int)((long *)CONCAT44(local_d8._12_4_,local_d8._8_4_))[1])
             ) {
            lVar17 = *(long *)CONCAT44(local_d8._12_4_,local_d8._8_4_);
            uVar23 = *(undefined8 *)(lVar17 + 0x10 + lVar19 * 0x18);
            aStack_90._8_3_ = (undefined3)uVar23;
            aStack_90._7_4_ = (uint)(uint3)aStack_90._8_3_ << 8;
            aStack_90.field10[0xb] = (undefined1)((ulong)uVar23 >> 0x18);
            aStack_90._12_4_ = (undefined4)((ulong)uVar23 >> 0x20);
            puVar3 = (undefined4 *)(lVar17 + lVar19 * 0x18);
            uVar26 = *puVar3;
            uVar28 = puVar3[1];
            local_d8._8_4_ = puVar3[2];
            local_d8._12_4_ = puVar3[3];
            goto LAB_0013d90b;
          }
          pcVar24 = "Invalid list index";
        }
        else {
          pcVar24 = "Expected type list";
        }
        gs_val_error((gs_val_t *)local_98,pcVar24);
        goto switchD_0013d5b0_default;
      }
    }
LAB_0013d8f9:
    aStack_90._7_4_ = local_d8._16_4_ << 8;
    aStack_90.field10[0xb] = SUB41(local_d8._16_4_,3);
    aStack_90._12_4_ = local_d8._20_4_;
    uVar26 = CONCAT13(local_d8[3],CONCAT12(local_d8[2],local_d8._0_2_));
    uVar28 = CONCAT13(local_d8[7],CONCAT21(local_d8._5_2_,local_d8[4]));
LAB_0013d90b:
    local_98._0_2_ = (undefined2)uVar26;
    local_98[2] = (undefined1)((uint)uVar26 >> 0x10);
    local_98[3] = (undefined1)((uint)uVar26 >> 0x18);
    local_98[4] = SUB41(uVar28,0);
    local_98._5_2_ = (undefined2)((uint)uVar28 >> 8);
    aStack_90.int_val._0_3_ = (undefined3)local_d8._8_4_;
    local_98[7] = (char)((uint)uVar28 >> 0x18);
    aStack_90._4_3_ = (undefined3)local_d8._12_4_;
    aStack_90._3_4_ = CONCAT31(aStack_90._4_3_,(char)((uint)local_d8._8_4_ >> 0x18));
    aStack_90.field10[7] = (undefined1)((uint)local_d8._12_4_ >> 0x18);
switchD_0013d5b0_default:
    *(ulong *)((long)&__return_storage_ptr__->field_2 + 8) =
         CONCAT44(aStack_90._12_4_,CONCAT13(aStack_90.field10[0xb],aStack_90._8_3_));
    local_68.type = CONCAT13(local_98[3],CONCAT12(local_98[2],local_98._0_2_));
    local_68._5_2_ = local_98._5_2_;
    local_68.is_return = local_98[4];
    local_68._7_1_ = local_98[7];
    local_b8.field_2.int_val = CONCAT13(aStack_90.field10[3],aStack_90.int_val._0_3_);
    local_b8.field_2.vec2_val.y = (float)CONCAT13(aStack_90.field10[7],aStack_90._4_3_);
    goto LAB_0013d921;
  case GS_EXPR_ARRAY_DECL:
    data = (vec_gs_val_t *)golf_alloc_tracked(0x18,"script/eval");
    data->data = (gs_val_t *)0x0;
    data->length = 0;
    data->capacity = 0;
    data->alloc_category = "script/eval";
    gVar21 = GS_VAL_INT;
    if ((expr->field_2).int_val < 1) {
      local_70._0_4_ = SUB84(data,0);
      pvVar15 = data;
      puVar22 = unaff_RBP;
      pgVar18 = __return_storage_ptr__;
    }
    else {
      local_78 = (gs_stmt_t *)&data->length;
      lVar19 = 0;
      local_70._0_4_ = SUB84(local_78,0);
      local_50 = __return_storage_ptr__;
      do {
        gs_eval_expr((gs_val_t *)local_d8,eval,
                     *(gs_expr_t **)(&((expr->field_2).binary_op.left)->type + lVar19 * 2));
        _Var9 = (_Bool)local_d8[4];
        __return_storage_ptr__ =
             (gs_val_t *)CONCAT71((int7)((ulong)__return_storage_ptr__ >> 8),local_d8[4]);
        if ((_Bool)local_d8[4] == true) {
          local_3c = CONCAT13(local_d8[3],CONCAT12(local_d8[2],local_d8._0_2_));
          local_b8.type._0_2_ = local_d8._5_2_;
          local_b8.type._2_1_ = local_d8[7];
          local_38 = (vec_gs_val_t *)CONCAT44(local_d8._12_4_,local_d8._8_4_);
          local_48 = (uint *)CONCAT44(local_d8._20_4_,local_d8._16_4_);
          local_70._0_4_ = SUB84(__return_storage_ptr__,0);
          pvVar15 = (vec_gs_val_t *)((ulong)__return_storage_ptr__ & 0xffffffff);
          gVar21 = GS_VAL_VEC3;
        }
        else {
          uVar11 = vec_expand_((char **)data,(int *)local_78,&data->capacity,0x18,
                               data->alloc_category);
          pvVar15 = (vec_gs_val_t *)(ulong)uVar11;
          gVar21 = GS_VAL_VOID;
          if (uVar11 == 0) {
            pvVar15 = (vec_gs_val_t *)data->data;
            iVar13 = data->length;
            data->length = iVar13 + 1;
            pvVar15[iVar13].alloc_category = (char *)CONCAT44(local_d8._20_4_,local_d8._16_4_);
            pvVar2 = pvVar15 + iVar13;
            pvVar2->data = (gs_val_t *)
                           CONCAT17(local_d8[7],
                                    CONCAT25(local_d8._5_2_,
                                             CONCAT14(local_d8[4],
                                                      CONCAT13(local_d8[3],
                                                               CONCAT12(local_d8[2],local_d8._0_2_))
                                                     )));
            pvVar2->length = local_d8._8_4_;
            pvVar2->capacity = local_d8._12_4_;
            gVar21 = GS_VAL_VOID;
          }
        }
        puVar22 = local_48;
        pgVar18 = local_50;
        if (_Var9 != false) goto LAB_0013d4e4;
        lVar19 = lVar19 + 1;
      } while (lVar19 < (expr->field_2).int_val);
      gVar21 = GS_VAL_INT;
      pvVar15 = (vec_gs_val_t *)(long)(expr->field_2).int_val;
    }
LAB_0013d4e4:
    uVar10 = SUB81(pvVar15,0);
    if (gVar21 == GS_VAL_VEC3) {
      golf_free_tracked(data->data);
      golf_free_tracked(data);
      local_d8[2] = local_b8.type._2_1_;
      local_d8._0_2_ = (undefined2)local_b8.type;
      uVar10 = (undefined1)local_70._0_4_;
    }
    else {
      local_38 = data;
      local_3c = gVar21;
      if (gVar21 == GS_VAL_INT) {
        piVar1 = &(eval->allocated_lists).length;
        iVar13 = vec_expand_((char **)&eval->allocated_lists,piVar1,
                             &(eval->allocated_lists).capacity,8,
                             (eval->allocated_lists).alloc_category);
        if (iVar13 == 0) {
          iVar13 = *piVar1;
          *piVar1 = iVar13 + 1;
          (eval->allocated_lists).data[iVar13] = data;
        }
        local_3c = GS_VAL_LIST;
        uVar10 = false;
      }
    }
    pgVar18->type = local_3c;
    pgVar18->is_return = (_Bool)uVar10;
    *(undefined2 *)&pgVar18->field_0x5 = local_d8._0_2_;
    pgVar18->field_0x7 = local_d8[2];
    (pgVar18->field_2).list_val = local_38;
    *(uint **)((long)&pgVar18->field_2 + 8) = puVar22;
    __return_storage_ptr__ = pgVar18;
    break;
  case GS_EXPR_CAST:
    gs_eval_expr(&local_b8,eval,(expr->field_2).binary_op.left);
    if (local_b8.is_return == false) {
      val_00.field_2._12_4_ = local_b8.field_2._12_4_;
      val_00.field_2.vec3_val.z = local_b8.field_2.vec3_val.z;
      val_00.type._2_1_ = local_b8.type._2_1_;
      val_00.type._0_2_ = (undefined2)local_b8.type;
      val_00.type._3_1_ = local_b8.type._3_1_;
      val_00.is_return = false;
      val_00._5_2_ = local_b8._5_2_;
      val_00._7_1_ = local_b8._7_1_;
      val_00.field_2._4_4_ = local_b8.field_2.vec2_val.y;
      val_00.field_2.int_val = local_b8.field_2.int_val;
      gs_eval_cast((gs_val_t *)local_d8,eval,val_00,(expr->field_2).cast.type);
      local_b8.field_2.vec3_val.z = (float)local_d8._16_4_;
      local_b8.field_2._12_4_ = local_d8._20_4_;
      local_b8.type._0_2_ = local_d8._0_2_;
      local_b8.type._2_1_ = local_d8[2];
      local_b8.type._3_1_ = local_d8[3];
      local_b8.is_return = (_Bool)local_d8[4];
      local_b8._5_2_ = local_d8._5_2_;
      local_b8._7_1_ = local_d8[7];
      local_b8.field_2.int_val = local_d8._8_4_;
      local_b8.field_2._4_4_ = local_d8._12_4_;
    }
    *(ulong *)((long)&__return_storage_ptr__->field_2 + 8) =
         CONCAT44(local_b8.field_2._12_4_,local_b8.field_2.vec3_val.z);
    local_68.type =
         CONCAT13(local_b8.type._3_1_,CONCAT12(local_b8.type._2_1_,(undefined2)local_b8.type));
    local_68._5_2_ = local_b8._5_2_;
    local_68.is_return = local_b8.is_return;
    local_68._7_1_ = local_b8._7_1_;
LAB_0013d921:
    __return_storage_ptr__->type = local_68.type;
    __return_storage_ptr__->is_return = local_68.is_return;
    *(int3 *)&__return_storage_ptr__->field_0x5 = local_68._5_3_;
    (__return_storage_ptr__->field_2).int_val = local_b8.field_2.int_val;
    (__return_storage_ptr__->field_2).vec2_val.y = local_b8.field_2.vec2_val.y;
  }
  return __return_storage_ptr__;
}

Assistant:

static gs_val_t gs_eval_expr(gs_eval_t *eval, gs_expr_t *expr) {
    gs_val_t val;
    switch (expr->type) {
        case GS_EXPR_BINARY_OP:
            val = gs_eval_expr_binary_op(eval, expr);
            break;
        case GS_EXPR_ASSIGNMENT:
            val = gs_eval_expr_assignment(eval, expr);
            break;
        case GS_EXPR_INT:
            val = gs_eval_expr_int(eval, expr);
            break;
        case GS_EXPR_FLOAT:
            val = gs_eval_expr_float(eval, expr);
            break;
        case GS_EXPR_SYMBOL:
            val = gs_eval_expr_symbol(eval, expr);
            break;
        case GS_EXPR_STRING:
            val = gs_eval_expr_string(eval, expr);
            break;
        case GS_EXPR_CALL:
            val = gs_eval_expr_call(eval, expr);
            break;
        case GS_EXPR_MEMBER_ACCESS:
            val = gs_eval_expr_member_access(eval, expr);
            break;
        case GS_EXPR_ARRAY_ACCESS:
            val = gs_eval_expr_array_access(eval, expr);
            break;
        case GS_EXPR_ARRAY_DECL:
            val = gs_eval_expr_array_decl(eval, expr);
            break;
        case GS_EXPR_CAST:
            val = gs_eval_expr_cast(eval, expr);
            break;
    }
    return val;
}